

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O3

bool gpt2_eval(gpt2_model *model,int n_threads,int n_past,
              vector<int,_std::allocator<int>_> *embd_inp,
              vector<float,_std::allocator<float>_> *embd_w,size_t *mem_per_token)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  void *__dest;
  ggml_tensor *pgVar7;
  pointer __dest_00;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  undefined8 uVar18;
  long lVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  undefined4 in_register_00000014;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long local_c8;
  long local_c0;
  
  piVar5 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar6 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar1 = (model->hparams).n_embd;
  lVar29 = (long)iVar1;
  uVar2 = (model->hparams).n_layer;
  lVar8 = (long)(model->hparams).n_ctx;
  iVar3 = (model->hparams).n_head;
  lVar9 = (long)iVar3;
  iVar4 = (model->hparams).n_vocab;
  if (gpt2_eval(gpt2_model_const&,int,int,std::vector<int,std::allocator<int>>const&,std::vector<float,std::allocator<float>>&,unsigned_long&)
      ::buf == '\0') {
    gpt2_eval();
  }
  uVar25 = (uint)((ulong)((long)piVar5 - (long)piVar6) >> 2);
  if ((*mem_per_token != 0) &&
     (uVar23 = *mem_per_token * (long)(int)uVar25,
     gpt2_eval::buf_size <= uVar23 && uVar23 - gpt2_eval::buf_size != 0)) {
    auVar31._8_4_ = (int)(uVar23 >> 0x20);
    auVar31._0_8_ = uVar23;
    auVar31._12_4_ = 0x45300000;
    dVar33 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) * 1.1;
    uVar23 = (ulong)dVar33;
    uVar23 = (long)(dVar33 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23;
    gpt2_eval::buf_size = uVar23;
    gpt2_eval::buf = realloc(gpt2_eval::buf,uVar23);
    if (gpt2_eval::buf == (void *)0x0) {
      fprintf(_stderr,"%s: failed to allocate %zu bytes\n","gpt2_eval",uVar23);
      return false;
    }
  }
  uVar23 = (ulong)(int)uVar25;
  uVar10 = ggml_init();
  uVar11 = ggml_new_graph(uVar10);
  lVar12 = ggml_new_tensor_1d(uVar10,0x1a,uVar23);
  __dest = *(void **)(lVar12 + 0xf8);
  piVar5 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar13 = ggml_element_size(lVar12);
  memcpy(__dest,piVar5,lVar13 * uVar23);
  lVar13 = ggml_new_tensor_1d(uVar10,0x1a,uVar23);
  auVar31 = _DAT_00120090;
  if (0 < (int)uVar25) {
    lVar24 = *(long *)(lVar13 + 0xf8);
    lVar26 = (ulong)(uVar25 & 0x7fffffff) - 1;
    auVar32._8_4_ = (int)lVar26;
    auVar32._0_8_ = lVar26;
    auVar32._12_4_ = (int)((ulong)lVar26 >> 0x20);
    lVar26 = 1;
    auVar32 = auVar32 ^ _DAT_00120090;
    uVar22 = CONCAT44(in_register_00000014,n_past);
    auVar34 = _DAT_00120080;
    do {
      auVar35 = auVar34 ^ auVar31;
      iVar28 = (int)uVar22;
      if ((bool)(~(auVar35._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar35._0_4_ ||
                  auVar32._4_4_ < auVar35._4_4_) & 1)) {
        *(int *)(lVar24 + -4 + lVar26 * 4) = iVar28;
      }
      if ((auVar35._12_4_ != auVar32._12_4_ || auVar35._8_4_ <= auVar32._8_4_) &&
          auVar35._12_4_ <= auVar32._12_4_) {
        *(int *)(lVar24 + lVar26 * 4) = iVar28 + 1;
      }
      lVar17 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 2;
      auVar34._8_8_ = lVar17 + 2;
      lVar17 = lVar26 - (ulong)(uVar25 + 1 & 0xfffffffe);
      lVar26 = lVar26 + 2;
      uVar22 = (ulong)(iVar28 + 2);
    } while (lVar17 != -1);
  }
  uVar14 = ggml_get_rows(uVar10,model->wte,lVar12);
  uVar15 = ggml_get_rows(uVar10,model->wpe,lVar13);
  uVar14 = ggml_add(uVar10,uVar14,uVar15);
  if (0 < (int)uVar2) {
    lVar13 = (long)(int)(uVar25 + n_past);
    lVar12 = (long)(int)((uVar25 + n_past) * iVar1);
    dVar33 = (double)((float)iVar1 / (float)iVar3);
    local_c0 = n_past * lVar29;
    lVar26 = 0;
    lVar24 = 0;
    local_c8 = 0;
    do {
      uVar15 = ggml_norm(uVar10);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ln_1_g +
                                   lVar26),uVar15);
      uVar16 = ggml_mul(uVar10,uVar16,uVar15);
      uVar15 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ln_1_b +
                                   lVar26),uVar15);
      uVar15 = ggml_add(uVar10,uVar16,uVar15);
      uVar15 = ggml_mul_mat(uVar10,*(undefined8 *)
                                    ((long)&((model->layers).
                                             super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            c_attn_attn_w + lVar26),uVar15);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           c_attn_attn_b + lVar26),uVar15);
      lVar17 = ggml_add(uVar10,uVar16,uVar15);
      uVar15 = ggml_view_2d(uVar10,lVar17,lVar29,uVar23,*(undefined8 *)(lVar17 + 0x38),0);
      uVar16 = ggml_view_2d(uVar10,lVar17,lVar29,uVar23,*(undefined8 *)(lVar17 + 0x38),lVar29 * 4);
      uVar18 = ggml_view_2d(uVar10,lVar17,lVar29,uVar23,*(undefined8 *)(lVar17 + 0x38),lVar29 * 8);
      lVar17 = lVar24;
      if (0 < (int)uVar25) {
        pgVar7 = model->memory_k;
        lVar19 = ggml_element_size(pgVar7);
        lVar17 = local_c8 * lVar8;
        uVar20 = ggml_view_1d(uVar10,pgVar7,(long)(int)(iVar1 * uVar25),lVar19 * local_c0);
        pgVar7 = model->memory_v;
        lVar19 = ggml_element_size(pgVar7);
        uVar21 = ggml_view_1d(uVar10,pgVar7,(long)(int)(iVar1 * uVar25),lVar19 * local_c0);
        uVar16 = ggml_cpy(uVar10,uVar16,uVar20);
        ggml_build_forward_expand(uVar11,uVar16);
        uVar16 = ggml_cpy(uVar10,uVar18,uVar21);
        ggml_build_forward_expand(uVar11,uVar16);
      }
      lVar27 = (long)(iVar1 / iVar3);
      uVar16 = ggml_new_tensor_3d(uVar10,0,lVar27,lVar9,uVar23);
      uVar15 = ggml_cpy(uVar10,uVar15,uVar16);
      uVar15 = ggml_permute(uVar10,uVar15,0,2,1,3);
      pgVar7 = model->memory_k;
      lVar19 = ggml_element_size(pgVar7);
      uVar16 = ggml_view_1d(uVar10,pgVar7,lVar12,lVar19 * lVar17 * lVar29);
      uVar16 = ggml_reshape_3d(uVar10,uVar16,lVar27,lVar9,lVar13);
      uVar16 = ggml_permute(uVar10,uVar16,0,2,1,3);
      uVar15 = ggml_mul_mat(uVar10,uVar16,uVar15);
      dVar30 = SQRT(dVar33);
      if (dVar33 < 0.0) {
        dVar30 = sqrt(dVar33);
      }
      uVar15 = ggml_scale_inplace((float)(1.0 / dVar30),uVar10,uVar15);
      uVar15 = ggml_diag_mask_inf_inplace(uVar10,uVar15,CONCAT44(in_register_00000014,n_past));
      uVar15 = ggml_soft_max_inplace(uVar10,uVar15);
      pgVar7 = model->memory_v;
      lVar19 = ggml_element_size(pgVar7);
      uVar16 = ggml_view_1d(uVar10,pgVar7,lVar12,lVar17 * lVar29 * lVar19);
      uVar16 = ggml_reshape_3d(uVar10,uVar16,lVar27,lVar9,lVar13);
      uVar16 = ggml_permute(uVar10,uVar16,1,2,0,3);
      uVar18 = ggml_new_tensor_3d(uVar10,model->memory_v->type,lVar13,lVar27,lVar9);
      uVar16 = ggml_cpy(uVar10,uVar16,uVar18);
      uVar15 = ggml_mul_mat(uVar10,uVar16,uVar15);
      uVar15 = ggml_permute(uVar10,uVar15,0,2,1);
      uVar16 = ggml_new_tensor_2d(uVar10,0,lVar29,uVar23);
      uVar15 = ggml_cpy(uVar10,uVar15,uVar16);
      uVar15 = ggml_mul_mat(uVar10,*(undefined8 *)
                                    ((long)&((model->layers).
                                             super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            c_attn_proj_w + lVar26),uVar15);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           c_attn_proj_b + lVar26),uVar15);
      uVar15 = ggml_add(uVar10,uVar16,uVar15);
      uVar14 = ggml_add(uVar10,uVar15,uVar14);
      uVar15 = ggml_norm(uVar10,uVar14);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ln_2_g +
                                   lVar26),uVar15);
      uVar16 = ggml_mul(uVar10,uVar16,uVar15);
      uVar15 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ln_2_b +
                                   lVar26),uVar15);
      uVar15 = ggml_add(uVar10,uVar16,uVar15);
      uVar15 = ggml_mul_mat(uVar10,*(undefined8 *)
                                    ((long)&((model->layers).
                                             super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w
                                    + lVar26),uVar15);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_b +
                                   lVar26),uVar15);
      uVar15 = ggml_add(uVar10,uVar16,uVar15);
      uVar15 = ggml_gelu(uVar10,uVar15);
      uVar15 = ggml_mul_mat(uVar10,*(undefined8 *)
                                    ((long)&((model->layers).
                                             super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            c_mlp_proj_w + lVar26),uVar15);
      uVar16 = ggml_repeat(uVar10,*(undefined8 *)
                                   ((long)&((model->layers).
                                            super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_b
                                   + lVar26),uVar15);
      uVar15 = ggml_add(uVar10,uVar16,uVar15);
      uVar14 = ggml_add(uVar10,uVar15,uVar14);
      local_c8 = local_c8 + 1;
      lVar24 = lVar24 + lVar8;
      local_c0 = local_c0 + lVar8 * lVar29;
      lVar26 = lVar26 + 0x60;
    } while ((ulong)uVar2 * 0x60 != lVar26);
  }
  uVar14 = ggml_norm(uVar10);
  uVar15 = ggml_repeat(uVar10,model->ln_f_g,uVar14);
  uVar15 = ggml_mul(uVar10,uVar15,uVar14);
  uVar14 = ggml_repeat(uVar10,model->ln_f_b,uVar14);
  uVar14 = ggml_add(uVar10,uVar15,uVar14);
  uVar14 = ggml_mul_mat(uVar10,model->lm_head,uVar14);
  ggml_build_forward_expand(uVar11,uVar14);
  ggml_graph_compute_with_ctx(uVar10,uVar11,n_threads);
  std::vector<float,_std::allocator<float>_>::resize(embd_w,(long)iVar4);
  __dest_00 = (embd_w->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
  lVar8 = ggml_get_data(uVar14);
  memcpy(__dest_00,(void *)(lVar8 + (long)(int)((uVar25 - 1) * iVar4) * 4),(long)iVar4 << 2);
  if (*mem_per_token == 0) {
    uVar22 = ggml_used_mem(uVar10);
    *mem_per_token = uVar22 / uVar23;
  }
  ggml_free(uVar10);
  return true;
}

Assistant:

bool gpt2_eval(
        const gpt2_model & model,
        const int n_threads,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp,
              std::vector<float>         & embd_w,
              size_t                     & mem_per_token) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;
    const int n_vocab = hparams.n_vocab;

    static size_t buf_size = 256u*1024*1024;
    static void * buf = malloc(buf_size);

    if (mem_per_token > 0 && mem_per_token*N > buf_size) {
        const size_t buf_size_new = 1.1*(mem_per_token*N); // add 10% to account for ggml object overhead
        //printf("\n%s: reallocating buffer from %zu to %zu bytes\n", __func__, buf_size, buf_size_new);

        // reallocate
        buf_size = buf_size_new;
        buf = realloc(buf, buf_size);
        if (buf == nullptr) {
            fprintf(stderr, "%s: failed to allocate %zu bytes\n", __func__, buf_size);
            return false;
        }
    }

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf,
        /*.no_alloc   =*/ false,
    };

    struct ggml_context * ctx0 = ggml_init(params);
    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    memcpy(embd->data, embd_inp.data(), N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, N);
    for (int i = 0; i < N; ++i) {
        ((int32_t *) position->data)[i] = n_past + i;
    }

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx0,
                ggml_get_rows(ctx0, model.wte, embd),
                ggml_get_rows(ctx0, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx0, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx0,
                    ggml_mul(ctx0,
                        ggml_repeat(ctx0, model.layers[il].ln_1_g, cur),
                        cur),
                    ggml_repeat(ctx0, model.layers[il].ln_1_b, cur));
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_attn_b, cur),
                    cur);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx0, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx0, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx0, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx0,
                        ggml_cpy(ctx0,
                            Qcur,
                            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_embd/n_head, n_head, N)),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx0,
                        ggml_reshape_3d(ctx0,
                            ggml_view_1d(ctx0, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale_inplace(ctx0, KQ, 1.0f/sqrt(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf_inplace(ctx0, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max_inplace(ctx0, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cpy(ctx0,
                        ggml_permute(ctx0,
                            ggml_reshape_3d(ctx0,
                                ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        ggml_new_tensor_3d(ctx0, model.memory_v->type, n_past + N, n_embd/n_head, n_head));

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cpy(ctx0,
                    KQV_merged,
                    ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, N));
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_attn_proj_b, cur),
                    cur);
        }

        // add the input
        cur = ggml_add(ctx0, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx0, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx0,
                        ggml_mul(ctx0,
                            ggml_repeat(ctx0, model.layers[il].ln_2_g, cur),
                            cur),
                        ggml_repeat(ctx0, model.layers[il].ln_2_b, cur));
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_fc_b, cur),
                    cur);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx0, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx0,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx0,
                    ggml_repeat(ctx0, model.layers[il].c_mlp_proj_b, cur),
                    cur);
        }

        // input for next layer
        inpL = ggml_add(ctx0, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx0, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx0,
                ggml_mul(ctx0,
                    ggml_repeat(ctx0, model.ln_f_g, inpL),
                    inpL),
                ggml_repeat(ctx0, model.ln_f_b, inpL));
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx0, model.lm_head, inpL);

    // logits -> probs
    //inpL = ggml_soft_max_inplace(ctx0, inpL);

    // run the computation
    ggml_build_forward_expand(gf, inpL);
    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    //embd_w.resize(n_vocab*N);
    //memcpy(embd_w.data(), ggml_get_data(inpL), sizeof(float)*n_vocab*N);

    // return result just for the last token
    embd_w.resize(n_vocab);
    memcpy(embd_w.data(), (float *) ggml_get_data(inpL) + (n_vocab*(N-1)), sizeof(float)*n_vocab);

    if (mem_per_token == 0) {
        mem_per_token = ggml_used_mem(ctx0)/N;
    }
    //printf("used_mem = %zu\n", ggml_used_mem(ctx0));

    ggml_free(ctx0);

    return true;
}